

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diy-fp.h
# Opt level: O0

void __thiscall double_conversion::DiyFp::Normalize(DiyFp *this)

{
  uint64_t k10MSBits;
  int32_t exponent;
  uint64_t significand;
  DiyFp *this_local;
  
  exponent = this->e_;
  for (significand = this->f_; (significand & 0xffc0000000000000) == 0;
      significand = significand << 10) {
    exponent = exponent + -10;
  }
  for (; (significand & 0x8000000000000000) == 0; significand = significand << 1) {
    exponent = exponent + -1;
  }
  this->f_ = significand;
  this->e_ = exponent;
  return;
}

Assistant:

void Normalize() {
    DOUBLE_CONVERSION_ASSERT(f_ != 0);
    uint64_t significand = f_;
    int32_t exponent = e_;

    // This method is mainly called for normalizing boundaries. In general,
    // boundaries need to be shifted by 10 bits, and we optimize for this case.
    const uint64_t k10MSBits = DOUBLE_CONVERSION_UINT64_2PART_C(0xFFC00000, 00000000);
    while ((significand & k10MSBits) == 0) {
      significand <<= 10;
      exponent -= 10;
    }
    while ((significand & kUint64MSB) == 0) {
      significand <<= 1;
      exponent--;
    }
    f_ = significand;
    e_ = exponent;
  }